

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

SharedPtr<vkt::pipeline::TestTexture2D> * __thiscall
de::SharedPtr<vkt::pipeline::TestTexture2D>::operator=
          (SharedPtr<vkt::pipeline::TestTexture2D> *this,
          SharedPtr<vkt::pipeline::TestTexture2D> *other)

{
  SharedPtr<vkt::pipeline::TestTexture2D> *other_local;
  SharedPtr<vkt::pipeline::TestTexture2D> *this_local;
  
  if (this->m_state != other->m_state) {
    release(this);
    this->m_ptr = other->m_ptr;
    this->m_state = other->m_state;
    acquire(this);
  }
  return this;
}

Assistant:

inline SharedPtr<T>& SharedPtr<T>::operator= (const SharedPtr<T>& other)
{
	if (m_state == other.m_state)
		return *this;

	// Release current reference.
	release();

	// Copy from other and acquire reference.
	m_ptr	= other.m_ptr;
	m_state	= other.m_state;

	acquire();

	return *this;
}